

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

bool __thiscall
GF2::MP<45UL,_GF2::MOGrlex<45UL>_>::Geobucket<4UL>::PopLM(Geobucket<4UL> *this,MM<45UL> *lm)

{
  undefined1 *this_00;
  pointer pMVar1;
  int iVar2;
  pointer pMVar3;
  long lVar4;
  long lStack_40;
  
  pMVar3 = (this->_buckets).
           super__Vector_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->_buckets).
                super__Vector_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3 >> 5;
  this_00 = &pMVar3->field_0x18;
  lStack_40 = -1;
  do {
    while (lVar4 = lVar4 + -1,
          pMVar3[lVar4].super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
          super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node._M_size
          == 0) {
LAB_001468fa:
      if (lVar4 == 0) {
        if (lStack_40 == -1) {
          return false;
        }
        std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::pop_front
                  (&(this->_buckets).
                    super__Vector_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lStack_40].
                    super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>);
        return true;
      }
      pMVar3 = (this->_buckets).
               super__Vector_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if (lStack_40 == -1) {
LAB_001468ec:
      (lm->super_WW<45UL>)._words[0] =
           (word)pMVar3[lVar4].super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
                 super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
                 super__List_node_base._M_next[1]._M_next;
      lStack_40 = lVar4;
      goto LAB_001468fa;
    }
    iVar2 = MOGrlex<45UL>::Compare
                      ((MOGrlex<45UL> *)this_00,
                       (MM<45UL> *)
                       (pMVar3[lVar4].super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
                        super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl.
                        _M_node.super__List_node_base._M_next + 1),lm);
    if (0 < iVar2) {
      pMVar3 = (this->_buckets).
               super__Vector_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_001468ec;
    }
    if (iVar2 != 0) goto LAB_001468fa;
    std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::pop_front
              (&(this->_buckets).
                super__Vector_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lStack_40].
                super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>);
    std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::pop_front
              (&(this->_buckets).
                super__Vector_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar4].
                super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>);
    pMVar3 = (this->_buckets).
             super__Vector_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar1 = (this->_buckets).
             super__Vector_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar4 = (long)pMVar1 - (long)pMVar3 >> 5;
    lStack_40 = -1;
    if (pMVar1 == pMVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool PopLM(MM<_n>& lm)
		{
			int cmp;
			size_t i = SIZE_MAX, j = (size_t)_buckets.size();
			const _O& o = _buckets[0].GetOrder();
			do
			{
				// пропускаем пустые корзины
				if (_buckets[--j].IsEmpty())
					continue;
				// новый старший моном?
				if (i == SIZE_MAX || (cmp = o.Compare(_buckets[j].LM(), lm)) > 0)
					lm = _buckets[i = j].LM();
				// одинаковые мономы?
				else if (cmp == 0) 
				{
					// удаляем мономы из корзин и начинаем все сначала
					_buckets[i].PopLM(), _buckets[j].PopLM();
					i = SIZE_MAX, j = (size_t)_buckets.size();
				}
			}
			while (j != 0);
			// моногочлен ненулевой?
			if (i != SIZE_MAX) _buckets[i].PopLM();
			// признак успеха
			return i != SIZE_MAX;
		}